

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O3

Result __thiscall
testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&)>::Perform
          (Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&)> *this,
          ArgumentTuple *args)

{
  if ((this->fun_).super__Function_base._M_manager == (_Manager_type)0x0) {
    internal::IllegalDoDefault
              ("/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/googletest/repo/googlemock/include/gmock/gmock-actions.h"
               ,0x1f0);
    if ((this->fun_).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
  }
  (*(this->fun_)._M_invoker)
            ((_Any_data *)this,
             (args->super__Tuple_impl<0UL,_std::shared_ptr<ot::commissioner::CommissionerApp>_&>).
             super__Head_base<0UL,_std::shared_ptr<ot::commissioner::CommissionerApp>_&,_false>.
             _M_head_impl);
  return;
}

Assistant:

Result Perform(ArgumentTuple args) const {
    if (IsDoDefault()) {
      internal::IllegalDoDefault(__FILE__, __LINE__);
    }
    return internal::Apply(fun_, ::std::move(args));
  }